

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O2

void array_suite::test_string(void)

{
  allocator<char> local_fa;
  allocator<char> local_f9;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> value;
  value_type input [11];
  iarchive in;
  
  input[0] = 0x92;
  input[1] = '\x02';
  input[2] = 0xa9;
  input[3] = '\x02';
  input[4] = 'A';
  input[5] = 'B';
  input[6] = 0xa9;
  input[7] = '\x02';
  input[8] = 'C';
  input[9] = 'D';
  input[10] = 0x93;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[11]>(&in,&input);
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,"",&local_f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(value._M_elems + 1),"",&local_fa);
  trial::protocol::bintoken::iarchive::load_override<std::array<std::__cxx11::string,2ul>>
            (&in,&value);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("value[0]","\"AB\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x33,"void array_suite::test_string()",&value,"AB");
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("value[1]","\"CD\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x34,"void array_suite::test_string()",(string *)(value._M_elems + 1),"CD");
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(&value);
  trial::protocol::bintoken::iarchive::~iarchive(&in);
  return;
}

Assistant:

void test_string()
{
    const value_type input[] = { token::code::begin_array,
                                 0x02,
                                 token::code::string8, 0x02, 0x41, 0x42,
                                 token::code::string8, 0x02, 0x43, 0x44,
                                 token::code::end_array };
    format::iarchive in(input);
    std::array<std::string, 2> value = {{ "", "" }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], "AB");
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], "CD");
}